

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O0

CVmException * err_get_cur_exc(void)

{
  long *in_FS_OFFSET;
  err_frame_t *fr;
  
  fr = *(err_frame_t **)(*in_FS_OFFSET + -8);
  while( true ) {
    if (fr == (err_frame_t *)0x0) {
      return (CVmException *)0x0;
    }
    if ((fr->state_ & 2U) != 0) break;
    fr = fr->prv_;
  }
  return fr->exc_;
}

Assistant:

CVmException *err_get_cur_exc()
{
    /* 
     *   search the error frame stack for a frame in the 'caught exception'
     *   state, starting at the current (innermost) frame 
     */
    for (err_frame_t *fr = os_tls_get(err_frame_t *, G_err_frame) ;
         fr != 0 ; fr = fr->prv_)
    {
        /* if this frame is in the 'caught' state, return its exception */
        if ((fr->state_ & ERR_STATE_CAUGHT) != 0)
            return fr->exc_;
    }

    /* didn't find an exception */
    return 0;
}